

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O1

FT_Error tt_size_run_fpgm(TT_Size size,FT_Bool pedantic)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  TT_Face face;
  TT_ExecContext exec;
  FT_ULong FVar3;
  FT_Byte *pFVar4;
  undefined8 uVar5;
  FT_Error FVar6;
  long lVar7;
  
  face = (TT_Face)(size->root).face;
  exec = size->context;
  FVar6 = TT_Load_Context(exec,face,size);
  if (FVar6 == 0) {
    FVar6 = 0;
    exec->callTop = 0;
    exec->top = 0;
    exec->period = 0x40;
    exec->phase = 0;
    exec->threshold = 0;
    exec->instruction_trap = '\0';
    exec->F_dot_P = 0x4000;
    exec->pedantic_hinting = pedantic;
    (exec->metrics).x_ppem = 0;
    (exec->metrics).y_ppem = 0;
    (exec->tt_metrics).ppem = 0;
    (exec->tt_metrics).scale = 0;
    (exec->metrics).x_scale = 0;
    (exec->metrics).y_scale = 0;
    (exec->tt_metrics).ratio = 0x10000;
    FVar3 = face->font_program_size;
    pFVar4 = face->font_program;
    exec->codeRangeTable[0].base = pFVar4;
    exec->codeRangeTable[0].size = FVar3;
    exec->codeRangeTable[1].base = (FT_Byte *)0x0;
    exec->codeRangeTable[1].size = 0;
    exec->codeRangeTable[2].base = (FT_Byte *)0x0;
    exec->codeRangeTable[2].size = 0;
    if (face->font_program_size != 0) {
      exec->code = pFVar4;
      exec->codeSize = FVar3;
      exec->IP = 0;
      exec->curRange = 1;
      FVar6 = (*face->interpreter)(exec);
    }
    size->bytecode_ready = FVar6;
    if (FVar6 == 0) {
      size->num_function_defs = exec->numFDefs;
      size->num_instruction_defs = exec->numIDefs;
      size->max_func = exec->maxFunc;
      size->max_ins = exec->maxIns;
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)&exec->codeRangeTable[0].base + lVar7);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&size->codeRangeTable[0].base + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x30);
    }
  }
  return FVar6;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_run_fpgm( TT_Size  size,
                    FT_Bool  pedantic )
  {
    TT_Face         face = (TT_Face)size->root.face;
    TT_ExecContext  exec;
    FT_Error        error;


    exec = size->context;

    error = TT_Load_Context( exec, face, size );
    if ( error )
      return error;

    exec->callTop = 0;
    exec->top     = 0;

    exec->period    = 64;
    exec->phase     = 0;
    exec->threshold = 0;

    exec->instruction_trap = FALSE;
    exec->F_dot_P          = 0x4000L;

    exec->pedantic_hinting = pedantic;

    {
      FT_Size_Metrics*  size_metrics = &exec->metrics;
      TT_Size_Metrics*  tt_metrics   = &exec->tt_metrics;


      size_metrics->x_ppem   = 0;
      size_metrics->y_ppem   = 0;
      size_metrics->x_scale  = 0;
      size_metrics->y_scale  = 0;

      tt_metrics->ppem  = 0;
      tt_metrics->scale = 0;
      tt_metrics->ratio = 0x10000L;
    }

    /* allow font program execution */
    TT_Set_CodeRange( exec,
                      tt_coderange_font,
                      face->font_program,
                      (FT_Long)face->font_program_size );

    /* disable CVT and glyph programs coderange */
    TT_Clear_CodeRange( exec, tt_coderange_cvt );
    TT_Clear_CodeRange( exec, tt_coderange_glyph );

    if ( face->font_program_size > 0 )
    {
      TT_Goto_CodeRange( exec, tt_coderange_font, 0 );

      FT_TRACE4(( "Executing `fpgm' table.\n" ));
      error = face->interpreter( exec );
#ifdef FT_DEBUG_LEVEL_TRACE
      if ( error )
        FT_TRACE4(( "  interpretation failed with error code 0x%x\n",
                    error ));
#endif
    }
    else
      error = FT_Err_Ok;

    size->bytecode_ready = error;

    if ( !error )
      TT_Save_Context( exec, size );

    return error;
  }